

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

void xfer_setup(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,int writesockindex,
               _Bool shutdown,_Bool shutdown_err_ignore)

{
  int *piVar1;
  connectdata *conn;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  curl_socket_t cVar5;
  curl_socket_t cVar6;
  uint uVar7;
  uint uVar8;
  
  conn = data->conn;
  _Var2 = Curl_req_want_send(data);
  _Var3 = Curl_conn_is_multiplex(conn,0);
  if (_Var3 || _Var2) {
    uVar4 = sockindex;
    if ((sockindex == -1) && (uVar4 = writesockindex, writesockindex == -1)) {
      cVar5 = -1;
    }
    else {
      cVar5 = conn->sock[uVar4];
    }
    conn->sockfd = cVar5;
    conn->writesockfd = cVar5;
    if (_Var2) {
      writesockindex = 0;
    }
  }
  else {
    cVar6 = -1;
    cVar5 = -1;
    if (sockindex != -1) {
      cVar5 = conn->sock[(uint)sockindex];
    }
    conn->sockfd = cVar5;
    if (writesockindex != -1) {
      cVar6 = conn->sock[(uint)writesockindex];
    }
    conn->writesockfd = cVar6;
  }
  uVar4 = *(uint *)&(data->req).field_0xd1;
  (data->req).size = size;
  uVar7 = (uint)shutdown_err_ignore << 0x15 | (uint)shutdown << 0x14;
  uVar8 = uVar7 | uVar4 & 0xffceffff | (uint)getheader << 0x10;
  *(uint *)&(data->req).field_0xd1 = uVar8;
  if (!getheader) {
    uVar8 = uVar7 | uVar4 & 0xffcefffe | (uint)getheader << 0x10;
    *(uint *)&(data->req).field_0xd1 = uVar8;
    if (0 < size) {
      Curl_pgrsSetDownloadSize(data,size);
      uVar8 = *(uint *)&(data->req).field_0xd1;
    }
  }
  if ((uVar8 & 0x30000) != 0x20000) {
    if (sockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
    if (writesockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
    }
  }
  return;
}

Assistant:

static void xfer_setup(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex,       /* socket index to write to, it may be the same we
                               read from. -1 disables */
  bool shutdown,            /* shutdown connection at transfer end. Only
                             * supported when sending OR receiving. */
  bool shutdown_err_ignore  /* errors during shutdown do not fail the
                             * transfer */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  bool want_send = Curl_req_want_send(data);

  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));
  DEBUGASSERT((writesockindex <= 1) && (writesockindex >= -1));
  DEBUGASSERT(!shutdown || (sockindex == -1) || (writesockindex == -1));

  if(Curl_conn_is_multiplex(conn, FIRSTSOCKET) || want_send) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
    if(want_send)
      /* special and HTTP-specific */
      writesockindex = FIRSTSOCKET;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[writesockindex];
  }

  k->getheader = getheader;
  k->size = size;
  k->shutdown = shutdown;
  k->shutdown_err_ignore = shutdown_err_ignore;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then do not do this! */
  if(k->getheader || !data->req.no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1)
      k->keepon |= KEEP_SEND;
  } /* if(k->getheader || !data->req.no_body) */

}